

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O2

void __thiscall
DBaseStatusBar::DrSmallNumberOuter(DBaseStatusBar *this,int val,int x,int y,bool center)

{
  DFrameBuffer *pDVar1;
  FTexture *pFVar2;
  uint uVar3;
  double local_38;
  
  pDVar1 = screen;
  uVar3 = 999;
  if (val < 999) {
    uVar3 = val;
  }
  if (val < 100) {
    if (val < 10) goto LAB_004bff49;
  }
  else {
    pFVar2 = FImageCollection::operator[](&this->Images,uVar3 / 100 + 0x17);
    DCanvas::DrawTexture((DCanvas *)pDVar1,pFVar2,(double)x,(double)y,0x400013a6,center,0);
    uVar3 = uVar3 % 100;
  }
  pDVar1 = screen;
  local_38 = (double)y;
  pFVar2 = FImageCollection::operator[](&this->Images,(int)uVar3 / 10 + 0x17);
  DCanvas::DrawTexture((DCanvas *)pDVar1,pFVar2,(double)(x + 4),local_38,0x400013a6,(ulong)center,0)
  ;
  uVar3 = (int)uVar3 % 10;
LAB_004bff49:
  pDVar1 = screen;
  local_38 = (double)y;
  pFVar2 = FImageCollection::operator[](&this->Images,uVar3 + 0x17);
  DCanvas::DrawTexture((DCanvas *)pDVar1,pFVar2,(double)(x + 8),local_38,0x400013a6,(ulong)center,0)
  ;
  return;
}

Assistant:

void DBaseStatusBar::DrSmallNumberOuter (int val, int x, int y, bool center) const
{
	int digit = 0;

	if (val > 999)
	{
		val = 999;
	}
	if (val > 99)
	{
		digit = val / 100;
		screen->DrawTexture (Images[imgSmNumbers + digit], x, y,
			DTA_HUDRules, center ? HUD_HorizCenter : HUD_Normal, TAG_DONE);
		val -= digit * 100;
	}
	if (val > 9 || digit)
	{
		digit = val / 10;
		screen->DrawTexture (Images[imgSmNumbers + digit], x+4, y,
			DTA_HUDRules, center ? HUD_HorizCenter : HUD_Normal, TAG_DONE);
		val -= digit * 10;
	}
	screen->DrawTexture (Images[imgSmNumbers + val], x+8, y,
		DTA_HUDRules, center ? HUD_HorizCenter : HUD_Normal, TAG_DONE);
}